

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintMessageDescriptors(Generator *this)

{
  int i;
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(this->file_ + 0x48); lVar1 = lVar1 + 1) {
    PrintDescriptor(this,(Descriptor *)(*(long *)(this->file_ + 0x50) + lVar2));
    google::protobuf::io::Printer::Print((char *)this->printer_);
    lVar2 = lVar2 + 0x78;
  }
  return;
}

Assistant:

void Generator::PrintMessageDescriptors() const {
  for (int i = 0; i < file_->message_type_count(); ++i) {
    PrintDescriptor(*file_->message_type(i));
    printer_->Print("\n");
  }
}